

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O1

Mat_<double> * mel_to_hz(Mat_<double> *__return_storage_ptr__,Mat_<double> *mels,bool htk)

{
  long lVar1;
  double dVar2;
  Mat_<bool> log_t;
  Mat m_1;
  Mat_<bool> local_368;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  long *local_2e8 [2];
  Mat local_2d8 [96];
  Mat local_278 [96];
  Mat local_218 [144];
  Mat local_188 [16];
  Mat local_178 [96];
  Mat local_118 [96];
  Mat aMStack_b8 [144];
  
  cv::operator*(local_188,66.66666666666667);
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  cv::operator+((MatExpr *)local_2e8,(Scalar_ *)local_188);
  cv::Mat::Mat(&__return_storage_ptr__->super_Mat);
  *(uint *)__return_storage_ptr__ = *(uint *)__return_storage_ptr__ & 0xfffff000 | 6;
  cv::Mat::Mat(&local_368.super_Mat);
  (**(code **)(*local_2e8[0] + 0x18))(local_2e8[0],local_2e8,&local_368,0xffffffff);
  cv::Mat_<double>::operator=(__return_storage_ptr__,&local_368.super_Mat);
  cv::Mat::~Mat(&local_368.super_Mat);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat(local_2d8);
  cv::Mat::~Mat(aMStack_b8);
  cv::Mat::~Mat(local_118);
  cv::Mat::~Mat(local_178);
  cv::operator>=((Mat *)local_2e8,14.999999999999998);
  cv::Mat::Mat(&local_368.super_Mat);
  local_368._0_4_ = local_368._0_4_ & 0xfffff000;
  cv::Mat::Mat(local_188);
  (**(code **)(*local_2e8[0] + 0x18))(local_2e8[0],local_2e8,local_188,0xffffffff);
  cv::Mat_<bool>::operator=(&local_368,local_188);
  cv::Mat::~Mat(local_188);
  cv::Mat::~Mat(local_218);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat(local_2d8);
  if (0 < (int)local_368._12_4_) {
    lVar1 = 0;
    do {
      if (*(char *)(local_368._16_8_ + lVar1) == '\x01') {
        dVar2 = exp((*(double *)(*(long *)&mels->field_0x10 + lVar1 * 8) + -14.999999999999998) *
                    0.06875177742094912);
        *(double *)(*(long *)&__return_storage_ptr__->field_0x10 + lVar1 * 8) = dVar2 * 1000.0;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < (int)local_368._12_4_);
  }
  cv::Mat::~Mat(&local_368.super_Mat);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> mel_to_hz(cv::Mat_<double> mels, bool htk = false) {
//    if (htk) {
//        return //python://700.0 * (10.0**(mels / 2595.0) - 1.0);
//    }
    // Fill in the linear scale
    double f_min = 0.0;
    double f_sp = 200.0 / 3;
    cv::Mat_<double> freqs = mels * f_sp + f_min;
    // And now the nonlinear scale
    double min_log_hz = 1000.0;                         // beginning of log region (Hz)
    double min_log_mel = (min_log_hz - f_min) / f_sp;   // same (Mels)
    double logstep = log(6.4) / 27.0;              // step size for log region
    // 对照Python平台的librosa库，移植
    //if (mels.ndim) {
    // If we have vector data, vectorize
    cv::Mat_<bool> log_t = (mels >= min_log_mel);
    for (int i = 0; i < log_t.cols; i++) {
        if (log_t(0, i)) {
            freqs(0, i) = cv::exp((mels(0, i) - min_log_mel) * logstep) * min_log_hz;
        }
    }
    //}
    return freqs;
}